

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

void __thiscall wasm_module_t::wasm_module_t(wasm_module_t *this,wasm_module_t *other)

{
  Object *pOVar1;
  Store *this_00;
  Index index;
  Index IVar2;
  
  pOVar1 = (other->super_wasm_ref_t).I.obj_;
  this_00 = (other->super_wasm_ref_t).I.store_;
  if (this_00 == (Store *)0x0) {
    index = 0;
  }
  else {
    index = wabt::interp::Store::CopyRoot(this_00,(other->super_wasm_ref_t).I.root_index_);
  }
  (this->super_wasm_ref_t).I.obj_ = pOVar1;
  (this->super_wasm_ref_t).I.store_ = this_00;
  if (this_00 == (Store *)0x0) {
    IVar2 = 0;
  }
  else {
    IVar2 = wabt::interp::Store::CopyRoot(this_00,index);
  }
  (this->super_wasm_ref_t).I.root_index_ = IVar2;
  if (pOVar1 != (Object *)0x0) {
    wabt::interp::Store::DeleteRoot(this_00,index);
  }
  wasm_byte_vec_copy(&this->binary,&other->binary);
  return;
}

Assistant:

wasm_module_t(const wasm_module_t& other) : wasm_ref_t(other.I) {
    wasm_byte_vec_copy(&binary, &other.binary);
  }